

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O0

SyntaxNode * __thiscall
slang::syntax::SyntaxRewriter<InterleavedRewriter>::parse
          (SyntaxRewriter<InterleavedRewriter> *this,string_view text)

{
  element_type *this_00;
  SyntaxNode *pSVar1;
  SourceManager *in_RDX;
  string_view in_stack_00000000;
  undefined1 in_stack_00000010 [16];
  undefined1 in_stack_00000030 [16];
  Bag *in_stack_00000040;
  SourceLibrary *in_stack_00000048;
  size_t in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  shared_ptr<slang::syntax::SyntaxTree> *__args;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *this_01;
  shared_ptr<slang::syntax::SyntaxTree> local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *pvStack_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  
  local_48 = ::sv(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __args = &local_88;
  Bag::Bag((Bag *)0x6fdbea);
  this_01 = (vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
             *)0x0;
  SyntaxTree::fromText
            ((string_view)in_stack_00000010,in_RDX,in_stack_00000000,(string_view)in_stack_00000030,
             in_stack_00000040,in_stack_00000048);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
  ::emplace_back<std::shared_ptr<slang::syntax::SyntaxTree>>(this_01,__args);
  std::shared_ptr<slang::syntax::SyntaxTree>::~shared_ptr
            ((shared_ptr<slang::syntax::SyntaxTree> *)0x6fdc5e);
  Bag::~Bag((Bag *)0x6fdc68);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::back(pvStack_50);
  this_00 = std::
            __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x6fdc81);
  pSVar1 = SyntaxTree::root(this_00);
  return pSVar1;
}

Assistant:

SyntaxNode& parse(std::string_view text) {
        tempTrees.emplace_back(SyntaxTree::fromText(text, *sourceManager));
        return tempTrees.back()->root();
    }